

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,bool is_descriptor,
               GeneratorContext *generator_context)

{
  EnumValueDescriptor *value;
  long lVar1;
  EnumDescriptor *desc;
  int iVar2;
  undefined4 extraout_var;
  int extraout_EDX;
  int32 value_00;
  long lVar3;
  int i;
  long lVar4;
  undefined1 auVar5 [12];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  ZeroCopyOutputStream *local_178;
  FileDescriptor *local_170;
  EnumDescriptor *local_168;
  long local_160;
  Printer printer;
  string fullname;
  string local_90;
  string filename;
  string local_50;
  
  local_170 = file;
  GeneratedClassFileName<google::protobuf::EnumDescriptor>(&filename,en,is_descriptor);
  iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
  local_178 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  io::Printer::Printer(&printer,local_178,'^');
  GenerateHead(local_170,&printer);
  FilenameToClassname(&fullname,&filename);
  auVar5 = std::__cxx11::string::find_last_of((char *)&fullname,0x38d6ed);
  iVar2 = auVar5._8_4_;
  lVar3 = auVar5._0_8_ << 0x20;
  if (lVar3 != -0x100000000) {
    std::__cxx11::string::substr((ulong)&local_198,(ulong)&fullname);
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"namespace ^name^;\n\n",(char (*) [5])0x38d8c6,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    io::Printer::Print<>(&printer,"use UnexpectedValueException;\n\n");
    iVar2 = extraout_EDX;
  }
  GenerateEnumDocComment(&printer,en,iVar2);
  if (lVar3 != -0x100000000) {
    std::__cxx11::string::substr((ulong)&local_198,(ulong)&fullname);
    std::__cxx11::string::operator=((string *)&fullname,(string *)&local_198);
    std::__cxx11::string::~string((string *)&local_198);
  }
  io::Printer::Print<char[5],std::__cxx11::string>
            (&printer,"class ^name^\n{\n",(char (*) [5])0x38d8c6,&fullname);
  Indent(&printer);
  lVar3 = 0;
  local_168 = en;
  for (lVar4 = 0; lVar4 < *(int *)(en + 0x2c); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(en + 0x30);
    value = (EnumValueDescriptor *)(lVar1 + lVar3);
    local_160 = lVar3;
    GenerateEnumValueDocComment(&printer,value);
    ConstantNamePrefix(&local_90,*(string **)value);
    std::operator+(&local_198,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)value);
    IntToString_abi_cxx11_(&local_50,(php *)(ulong)*(uint *)(lVar1 + 0x10 + local_160),value_00);
    io::Printer::Print<char[5],std::__cxx11::string,char[7],std::__cxx11::string>
              (&printer,"const ^name^ = ^number^;\n",(char (*) [5])0x38d8c6,&local_198,
               (char (*) [7])0x3abb91,&local_50);
    en = local_168;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    lVar3 = local_160 + 0x28;
  }
  io::Printer::Print<>(&printer,"\nprivate static $valueToName = [\n");
  Indent(&printer);
  lVar4 = 0;
  for (lVar3 = 0; desc = local_168, lVar3 < *(int *)(local_168 + 0x2c); lVar3 = lVar3 + 1) {
    lVar1 = *(long *)(local_168 + 0x30);
    ConstantNamePrefix(&local_90,*(string **)(lVar1 + lVar4));
    std::operator+(&local_198,&local_90,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (lVar1 + lVar4));
    io::Printer::Print<char[5],std::__cxx11::string>
              (&printer,"self::^name^ => \'^name^\',\n",(char (*) [5])0x38d8c6,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_90);
    lVar4 = lVar4 + 0x28;
  }
  Outdent(&printer);
  io::Printer::Print<>(&printer,"];\n");
  io::Printer::Print<>(&printer,"\npublic static function name($value)\n{\n");
  Indent(&printer);
  io::Printer::Print<>(&printer,"if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  io::Printer::Print<>(&printer,"throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  io::Printer::Print<>
            (&printer,"\'Enum %s has no name defined for value %s\', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\nreturn self::$valueToName[$value];\n");
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n\n");
  io::Printer::Print<>(&printer,"\npublic static function value($name)\n{\n");
  Indent(&printer);
  io::Printer::Print<>
            (&printer,"$const = __CLASS__ . \'::\' . strtoupper($name);\nif (!defined($const)) {\n")
  ;
  Indent(&printer);
  io::Printer::Print<>(&printer,"throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  io::Printer::Print<>
            (&printer,"\'Enum %s has no value defined for name %s\', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\nreturn constant($const);\n");
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n");
  Outdent(&printer);
  io::Printer::Print<>(&printer,"}\n\n");
  if (*(long *)(desc + 0x18) != 0) {
    io::Printer::Print<>
              (&printer,
               "// Adding a class alias for backwards compatibility with the previous class name.\n"
              );
    LegacyFullClassName<google::protobuf::EnumDescriptor>(&local_198,desc,is_descriptor);
    io::Printer::Print<char[4],std::__cxx11::string,char[4],std::__cxx11::string>
              (&printer,"class_alias(^new^::class, \\^old^::class);\n\n",(char (*) [4])"new",
               &fullname,(char (*) [4])"old",&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    LegacyGenerateClassFile<google::protobuf::EnumDescriptor>
              (local_170,desc,is_descriptor,generator_context);
  }
  std::__cxx11::string::~string((string *)&fullname);
  io::Printer::~Printer(&printer);
  if (local_178 != (ZeroCopyOutputStream *)0x0) {
    (*local_178->_vptr_ZeroCopyOutputStream[1])();
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      bool is_descriptor, GeneratorContext* generator_context) {
  std::string filename = GeneratedClassFileName(en, is_descriptor);
  std::unique_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (lastindex != string::npos) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));

    // We only need this 'use' statement if the enum has a namespace.
    // Otherwise, we get a warning that the use statement has no effect.
    printer.Print("use UnexpectedValueException;\n\n");
  }

  GenerateEnumDocComment(&printer, en, is_descriptor);

  if (lastindex != string::npos) {
    fullname = fullname.substr(lastindex + 1);
  }

  printer.Print(
      "class ^name^\n"
      "{\n",
      "name", fullname);
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ConstantNamePrefix(value->name()) + value->name(),
                  "number", IntToString(value->number()));
  }

  printer.Print("\nprivate static $valueToName = [\n");
  Indent(&printer);
  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    printer.Print("self::^name^ => '^name^',\n",
                  "name", ConstantNamePrefix(value->name()) + value->name());
  }
  Outdent(&printer);
  printer.Print("];\n");

  printer.Print(
      "\npublic static function name($value)\n"
      "{\n");
  Indent(&printer);
  printer.Print("if (!isset(self::$valueToName[$value])) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no name defined for value %s', __CLASS__, $value));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return self::$valueToName[$value];\n");
  Outdent(&printer);
  printer.Print("}\n\n");

  printer.Print(
      "\npublic static function value($name)\n"
      "{\n");
  Indent(&printer);
  printer.Print("$const = __CLASS__ . '::' . strtoupper($name);\n"
                "if (!defined($const)) {\n");
  Indent(&printer);
  printer.Print("throw new UnexpectedValueException(sprintf(\n");
  Indent(&printer);
  Indent(&printer);
  printer.Print("'Enum %s has no value defined for name %s', __CLASS__, $name));\n");
  Outdent(&printer);
  Outdent(&printer);
  Outdent(&printer);
  printer.Print("}\n"
                "return constant($const);\n");
  Outdent(&printer);
  printer.Print("}\n");

  Outdent(&printer);
  printer.Print("}\n\n");

  // write legacy file for backwards compatiblity with nested messages and enums
  if (en->containing_type() != NULL) {
    printer.Print(
        "// Adding a class alias for backwards compatibility with the previous class name.\n");
    printer.Print(
        "class_alias(^new^::class, \\^old^::class);\n\n",
        "new", fullname,
        "old", LegacyFullClassName(en, is_descriptor));
    LegacyGenerateClassFile(file, en, is_descriptor, generator_context);
  }
}